

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O0

int __thiscall andyzip::brotli_decoder::read_256(brotli_decoder *this,brotli_decoder_state *s)

{
  ssize_t sVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  int nlt5x;
  int nlt14;
  int nlt0;
  brotli_decoder_state *s_local;
  brotli_decoder *this_local;
  
  sVar1 = brotli_decoder_state::read(s,1,in_RDX,in_RCX);
  if (s->error == ok) {
    if ((int)sVar1 == 0) {
      this_local._4_4_ = 1;
    }
    else {
      sVar1 = brotli_decoder_state::read(s,3,__buf,in_RCX);
      if (s->error == ok) {
        if ((int)sVar1 == 0) {
          this_local._4_4_ = 2;
        }
        else {
          sVar2 = brotli_decoder_state::read(s,(int)sVar1,__buf_00,in_RCX);
          if (s->error == ok) {
            this_local._4_4_ = (1 << ((byte)sVar1 & 0x1f)) + (int)sVar2 + 1;
          }
          else {
            this_local._4_4_ = 0;
          }
        }
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int read_256(brotli_decoder_state &s) {
      int nlt0 = s.read(1);
      if (s.error != error_code::ok) return 0; 

      if (!nlt0) return 1;

      int nlt14 = s.read(3);
      if (s.error != error_code::ok) return 0; 

      if (!nlt14) return 2;

      int nlt5x = s.read(nlt14);
      if (s.error != error_code::ok) return 0; 

      return (1 << nlt14) + nlt5x + 1;
    }